

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_dimstyle.cpp
# Opt level: O3

bool __thiscall ON_V5x_DimStyle::Internal_Read_v5(ON_V5x_DimStyle *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  wchar_t *component_name;
  ON_TextStyle *src;
  ON_UUID *pOVar3;
  int minor_version;
  uint not_used;
  int text_style_index;
  uint ui;
  ON_wString dimstyle_name;
  int dimstyle_index;
  int major_version;
  int local_68 [2];
  ON__INT32 local_60;
  ON__UINT32 local_5c;
  ON_wString local_58;
  int local_4c;
  ON_UUID local_48;
  int local_2c;
  
  ON_ModelComponent::ClearModelComponentAttributes(&this->super_ON_ModelComponent,0x1ff);
  local_2c = 0;
  local_68[0] = 0;
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_2c,local_68);
  if (local_2c < 1) {
    return false;
  }
  local_4c = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
  if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadInt(file,&local_4c), bVar1)) {
    ON_ModelComponent::SetIndex(&this->super_ON_ModelComponent,local_4c);
    ON_wString::ON_wString(&local_58);
    bVar1 = ON_BinaryArchive::ReadString(file,&local_58);
    if (!bVar1) goto LAB_004b20b7;
    component_name = ON_wString::operator_cast_to_wchar_t_(&local_58);
    ON_ModelComponent::SetName(&this->super_ON_ModelComponent,component_name);
    bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_extextension);
    if ((((!bVar1) || (bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_extoffset), !bVar1)) ||
        (bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_arrowsize), !bVar1)) ||
       (bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_centermark), !bVar1)) goto LAB_004b20b7;
    bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_textgap);
    local_5c = 0;
    if ((!bVar1) || (bVar1 = ON_BinaryArchive::ReadInt(file,&local_5c), !bVar1)) goto LAB_004b20bf;
    this->m_dimstyle_textalign = (V5_TextDisplayMode)local_5c;
    bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_arrowtype);
    if ((((!bVar1) ||
         ((bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_angularunits), !bVar1 ||
          (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_lengthformat), !bVar1)))) ||
        (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_angleformat), !bVar1)) ||
       (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_lengthresolution), !bVar1))
    goto LAB_004b20bf;
    bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_angleresolution);
    local_60 = -0x7fffffff;
    if ((!bVar1) || (bVar1 = ON_BinaryArchive::ReadInt(file,&local_60), !bVar1)) goto LAB_004b20c7;
    src = ON_BinaryArchive::ArchiveTextStyleFromArchiveTextStyleIndex(file,local_60);
    if (src != (ON_TextStyle *)0x0) {
      ON_TextStyle::operator=(&this->m_v5_text_style,src);
    }
    if ((local_68[0] < 3) &&
       (ON_ModelComponent::SetId(&this->super_ON_ModelComponent), local_68[0] < 1)) {
      ON_wString::~ON_wString(&local_58);
      goto LAB_004b22f4;
    }
    bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_textheight);
  }
  else {
    ON_wString::ON_wString(&local_58);
LAB_004b20b7:
    local_5c = 0;
LAB_004b20bf:
    local_60 = -0x7fffffff;
LAB_004b20c7:
    bVar1 = false;
  }
  if (1 < local_68[0]) {
    if (bVar1 == false) {
LAB_004b21fe:
      local_68[1] = 0;
      bVar1 = false;
    }
    else {
      bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_lengthfactor);
      if (!bVar1) goto LAB_004b21fe;
      ON_Internal_FixBogusDimStyleLengthFactor(file,&this->m_lengthfactor);
      bVar1 = ON_BinaryArchive::ReadString(file,&this->m_prefix);
      if (((!bVar1) || (bVar1 = ON_BinaryArchive::ReadString(file,&this->m_suffix), !bVar1)) ||
         (bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bAlternate), !bVar1)) goto LAB_004b21fe;
      bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_alternate_lengthfactor);
      if (!bVar1) goto LAB_004b21fe;
      ON_Internal_FixBogusDimStyleLengthFactor(file,&this->m_alternate_lengthfactor);
      bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_alternate_lengthformat);
      if (((!bVar1) ||
          (bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_alternate_lengthresolution), !bVar1)) ||
         ((bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_alternate_angleformat), !bVar1 ||
          ((bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_alternate_angleresolution), !bVar1 ||
           (bVar1 = ON_BinaryArchive::ReadString(file,&this->m_alternate_prefix), !bVar1))))))
      goto LAB_004b21fe;
      bVar1 = ON_BinaryArchive::ReadString(file,&this->m_alternate_suffix);
      local_68[1] = 0;
      if (!bVar1) goto LAB_004b21fe;
      bVar1 = ON_BinaryArchive::ReadInt(file,(ON__UINT32 *)(local_68 + 1));
    }
    if (2 < local_68[0]) {
      pOVar3 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
      local_48 = *pOVar3;
      if (bVar1 == false) {
        bVar1 = false;
      }
      else {
        bVar1 = ON_BinaryArchive::ReadUuid(file,&local_48);
        if (bVar1) {
          bVar2 = ::operator==(&ON_nil_uuid,&local_48);
          if (bVar2) {
            local_48 = ON_CreateId();
          }
          ON_ModelComponent::SetId(&this->super_ON_ModelComponent,&local_48);
        }
      }
      if (3 < local_68[0]) {
        if (bVar1 != false) {
          bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_dimextension);
        }
        if (4 < local_68[0]) {
          if (bVar1 != false) {
            bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_leaderarrowsize);
          }
          if (bVar1 != false) {
            bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_leaderarrowtype);
          }
          if (bVar1 != false) {
            bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bSuppressExtension1);
          }
          if (bVar1 != false) {
            bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bSuppressExtension2);
          }
        }
      }
    }
  }
  ON_wString::~ON_wString(&local_58);
  if (bVar1 == false) {
    return false;
  }
LAB_004b22f4:
  ON_ModelComponent::IfIdIsNilSetId(&this->super_ON_ModelComponent);
  return true;
}

Assistant:

bool ON_V5x_DimStyle::Internal_Read_v5(
  ON_BinaryArchive& file // restore definition from binary archive
  )
{
  ClearModelComponentAttributes(ON_ModelComponent::Attributes::AllAttributes);

  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);


  if ( major_version >= 1 ) 
  {
    int dimstyle_index = Index();
    if ( rc) rc = file.ReadInt( &dimstyle_index);
    if ( rc )
      SetIndex(dimstyle_index);

    ON_wString dimstyle_name;
    if ( rc) rc = file.ReadString( dimstyle_name);
    if (rc)
      SetName(dimstyle_name);
    
    if ( rc) rc = file.ReadDouble( &m_extextension);
    if ( rc) rc = file.ReadDouble( &m_extoffset);
    if ( rc) rc = file.ReadDouble( &m_arrowsize);
    if ( rc) rc = file.ReadDouble( &m_centermark);
    if ( rc) rc = file.ReadDouble( &m_textgap);
    
    unsigned int ui = 0;
    if (rc) rc = file.ReadInt(&ui);
    if (rc) m_dimstyle_textalign = (ON_INTERNAL_OBSOLETE::V5_TextDisplayMode)ui;
    if ( rc) rc = file.ReadInt( &m_arrowtype);
    if ( rc) rc = file.ReadInt( &m_angularunits);
    if ( rc) rc = file.ReadInt( &m_lengthformat);
    if ( rc) rc = file.ReadInt( &m_angleformat);
    if ( rc) rc = file.ReadInt( &m_lengthresolution);
    if ( rc) rc = file.ReadInt( &m_angleresolution);
    int text_style_index = ON_UNSET_INT_INDEX;
    if ( rc) rc = file.ReadInt( &text_style_index);
    if (rc)
    {
      const ON_TextStyle* text_style = file.ArchiveTextStyleFromArchiveTextStyleIndex(text_style_index);
      if (text_style)
        m_v5_text_style = *text_style;
    }

    if ( rc && minor_version < 3 )
      SetId(); // older versions did not have an id.

    if( minor_version >= 1)
      if ( rc) rc = file.ReadDouble( &m_textheight);

    // added 1/13/05
    if( minor_version >= 2)
    {
      if (rc)
      {
        rc = file.ReadDouble(&m_lengthfactor);
        if (rc)
          ON_Internal_FixBogusDimStyleLengthFactor(file, m_lengthfactor);
      }

      if (rc) rc = file.ReadString( m_prefix);
      if (rc) rc = file.ReadString( m_suffix);

      if (rc) rc = file.ReadBool( &m_bAlternate);
      if (rc) rc = file.ReadDouble(&m_alternate_lengthfactor);
      if (rc)
        ON_Internal_FixBogusDimStyleLengthFactor(file, m_alternate_lengthfactor);

      if (rc) rc = file.ReadInt( &m_alternate_lengthformat);
      if (rc) rc = file.ReadInt( &m_alternate_lengthresolution);
      if (rc) rc = file.ReadInt( &m_alternate_angleformat);
      if (rc) rc = file.ReadInt( &m_alternate_angleresolution);
      if (rc) rc = file.ReadString( m_alternate_prefix);
      if (rc) rc = file.ReadString( m_alternate_suffix);

      unsigned int not_used = 0;
      if (rc) rc = file.ReadInt( &not_used);

      if ( minor_version >= 3 )
      {
        ON_UUID dimstyle_id = Id();
        if (rc) rc = file.ReadUuid(dimstyle_id);
        if (rc)
        {
          if (ON_nil_uuid == dimstyle_id)
            dimstyle_id = ON_CreateId();  // non-nil id is required
          SetId(dimstyle_id);
        }
      }
    }
    // Added Dec 28, 05 ver 1.4
    if( minor_version >= 4)
      if( rc) rc = file.ReadDouble( &m_dimextension);

    // Added Mar 23 06 ver 1.5
    if( minor_version >= 5)
    {
      if (rc) rc = file.ReadDouble( &m_leaderarrowsize);
      if (rc) rc = file.ReadInt( &m_leaderarrowtype);
      if (rc) rc = file.ReadBool( &m_bSuppressExtension1);
      if (rc) rc = file.ReadBool( &m_bSuppressExtension2);
    }
  }
  else
    rc = false;

  if (rc)
    IfIdIsNilSetId();

  return rc;
}